

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e2etest.cc
# Opt level: O3

void e2e_robust_test(void)

{
  time_t tVar1;
  long lVar2;
  fdb_config *pfVar3;
  undefined8 *puVar4;
  byte bVar5;
  fdb_config in_stack_00002b70;
  undefined8 auStack_208 [31];
  timeval __test_begin;
  fdb_config fconfig;
  
  bVar5 = 0;
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  tVar1 = time((time_t *)0x0);
  srand((uint)tVar1);
  fdb_get_default_config();
  fconfig.wal_threshold = 0x400;
  fconfig.flags = 1;
  fconfig.compaction_mode = '\x01';
  fconfig.seqtree_opt = '\x01';
  fconfig.durability_opt = '\x02';
  fconfig.purging_interval = 0x50;
  pfVar3 = &fconfig;
  puVar4 = auStack_208;
  for (lVar2 = 0x1f; lVar2 != 0; lVar2 = lVar2 + -1) {
    *puVar4 = *(undefined8 *)pfVar3;
    pfVar3 = (fdb_config *)((long)pfVar3 + (ulong)bVar5 * -0x10 + 8);
    puVar4 = puVar4 + (ulong)bVar5 * -2 + 1;
  }
  e2e_robust_pattern(in_stack_00002b70);
  fprintf(_stderr,"%s PASSED\n","TEST: e2e robust test");
  return;
}

Assistant:

void e2e_robust_test() {
    TEST_INIT();

    randomize();
    fdb_config fconfig = fdb_get_default_config();
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_mode=FDB_COMPACTION_AUTO;
    fconfig.durability_opt = FDB_DRB_ASYNC;
    fconfig.seqtree_opt = FDB_SEQTREE_USE; // enable seqtree since get_byseq
    // to allow iterators to validate docs across async compaction
    // specify purging_interval so deleted docs are not dropped by
    // compactor immediately..
    fconfig.purging_interval = 80;

    // test
    e2e_robust_pattern(fconfig);

    TEST_RESULT("TEST: e2e robust test");
}